

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

_Bool ecs_query_next_worker(ecs_iter_t *it,int32_t current,int32_t total)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  int32_t count;
  int32_t prev_offset;
  int32_t first;
  int32_t per_worker;
  int32_t total_local;
  int32_t current_local;
  ecs_iter_t *it_local;
  
  iVar1 = it->offset;
  while( true ) {
    _Var2 = ecs_query_next(it);
    if (!_Var2) {
      return false;
    }
    prev_offset = it->count / total;
    count = prev_offset * current;
    iVar3 = it->count - prev_offset * total;
    if (iVar3 != 0) {
      if (current < iVar3) {
        prev_offset = prev_offset + 1;
        count = current + count;
      }
      else {
        count = iVar3 + count;
      }
    }
    if ((prev_offset == 0) && ((it->query->flags & 1) == 0)) break;
    if (prev_offset != 0) {
      it->frame_offset = it->frame_offset - iVar1;
      it->count = prev_offset;
      it->offset = count + it->offset;
      it->entities = it->entities + count;
      it->frame_offset = count + it->frame_offset;
      return true;
    }
  }
  if (current == 0) {
    return true;
  }
  return false;
}

Assistant:

bool ecs_query_next_worker(
    ecs_iter_t *it,
    int32_t current,
    int32_t total)
{
    int32_t per_worker, first, prev_offset = it->offset;

    do {
        if (!ecs_query_next(it)) {
            return false;
        }

        int32_t count = it->count;
        per_worker = count / total;
        first = per_worker * current;

        count -= per_worker * total;

        if (count) {
            if (current < count) {
                per_worker ++;
                first += current;
            } else {
                first += count;
            }
        }

        if (!per_worker && !(it->query->flags & EcsQueryNeedsTables)) {
            if (current == 0) {
                return true;
            } else {
                return false;
            }
        }
    } while (!per_worker);

    it->frame_offset -= prev_offset;
    it->count = per_worker;
    it->offset += first;
    it->entities = &it->entities[first];
    it->frame_offset += first;

    return true;
}